

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

ByteData256 *
cfd::CollectSighashByTx
          (Transaction *transaction,OutPoint *outpoint,UtxoData *utxo,SigHashType *sighash_type,
          Pubkey *pubkey,Script *redeem_script,WitnessVersion witness_version,ByteData *param_8,
          TaprootScriptTree *param_9)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  long in_RCX;
  Script *in_RSI;
  ByteData256 *in_RDI;
  SigHashType *in_R8;
  Script *in_stack_00000008;
  undefined4 in_stack_00000010;
  Script script_data;
  uint32_t index;
  ByteData256 *sighash;
  Script *in_stack_fffffffffffffec0;
  SigHashType local_104 [12];
  undefined1 local_f8 [31];
  undefined1 local_d9;
  Script local_d8;
  Script local_a0;
  undefined1 local_58 [36];
  int local_34;
  SigHashType *local_28;
  long local_20;
  Script *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  cfd::core::OutPoint::GetTxid();
  uVar2 = cfd::core::OutPoint::GetVout();
  iVar3 = (*in_RSI->_vptr_Script[2])(in_RSI,local_58,(ulong)uVar2);
  core::Txid::~Txid((Txid *)0x3c8105);
  local_34 = iVar3;
  cfd::core::Script::Script(&local_a0,in_stack_00000008);
  bVar1 = cfd::core::Script::IsEmpty();
  if ((bVar1 & 1) != 0) {
    cfd::core::ScriptUtil::CreateP2pkhLockingScript((Pubkey *)&local_d8);
    cfd::core::Script::operator=(&local_a0,&local_d8);
    core::Script::~Script(in_stack_fffffffffffffec0);
  }
  iVar3 = local_34;
  local_d9 = 0;
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_104,local_28);
  cfd::core::Transaction::GetSignatureHash
            (in_RDI,local_10,iVar3,local_f8,local_104,local_20 + 600,in_stack_00000010);
  core::ByteData::~ByteData((ByteData *)0x3c8266);
  local_d9 = 1;
  core::Script::~Script(local_10);
  return in_RDI;
}

Assistant:

static ByteData256 CollectSighashByTx(
    const Transaction* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script,
    WitnessVersion witness_version, const ByteData*,
    const TaprootScriptTree*) {
  uint32_t index =
      transaction->GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  Script script_data = redeem_script;
  if (script_data.IsEmpty()) {
    script_data = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  }
  auto sighash = transaction->GetSignatureHash(
      index, script_data.GetData(), sighash_type, utxo.amount,
      witness_version);
  return sighash;
}